

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_28494c::CAPIExternalCommand::processMakefileDiscoveredDependencies
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          string *depsPath,bool ignoreSubsequentOutputs)

{
  char *in_start;
  bool bVar1;
  FileSystem *pFVar2;
  BuildSystemDelegate *pBVar3;
  long *plVar4;
  void *pvVar5;
  Child *pCVar6;
  Child CVar7;
  SmallString<4096U> absPath;
  Child local_10c0;
  long local_10b8;
  Child local_10b0;
  undefined1 local_10a8;
  void *local_10a0;
  CAPIExternalCommand *local_1098;
  Child local_1090;
  Child local_1088 [3];
  Twine local_1070;
  Twine local_1058;
  Child local_1040;
  BuildSystem *local_1038;
  Child local_1030;
  void *pvStack_1028;
  CAPIExternalCommand *local_1020;
  _func_int **local_1018;
  _func_int **pp_Stack_1010;
  int local_1008;
  
  pvVar5 = ti.ctx;
  local_1090 = (Child)ti.impl;
  llvm::Twine::Twine((Twine *)&local_1040,(string *)context);
  bVar1 = llvm::sys::path::is_absolute((Twine *)&local_1040,native);
  if (bVar1) {
    pFVar2 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    (*pFVar2->_vptr_FileSystem[4])(&local_1040,pFVar2,context);
    CVar7 = local_1040;
  }
  else {
    in_start = (this->workingDirectory)._M_dataplus._M_p;
    local_1040.twine = (Twine *)&local_1030;
    local_1038 = (BuildSystem *)0x100000000000;
    local_10a0 = pvVar5;
    local_1098 = this;
    llvm::SmallVectorImpl<char>::append<char_const*,void>
              ((SmallVectorImpl<char> *)&local_1040,in_start,
               in_start + (this->workingDirectory)._M_string_length);
    llvm::Twine::Twine((Twine *)&local_10c0,(string *)context);
    llvm::Twine::Twine((Twine *)local_1088,"");
    llvm::Twine::Twine(&local_1058,"");
    llvm::Twine::Twine(&local_1070,"");
    llvm::sys::path::append
              ((SmallVectorImpl<char> *)&local_1040,(Twine *)&local_10c0,(Twine *)local_1088,
               &local_1058,&local_1070);
    llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)&local_1040);
    pFVar2 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    if (&(local_1040.twine)->LHS == (Child *)0x0) {
      local_10c0.twine = (Twine *)&local_10b0;
      local_10b8 = 0;
      local_10b0.twine = local_10b0.twine & 0xffffffffffffff00;
    }
    else {
      local_10c0.twine = (Twine *)&local_10b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10c0,local_1040.twine,
                 (long)&(local_1040.twine)->LHS + ((ulong)local_1038 & 0xffffffff));
    }
    (*pFVar2->_vptr_FileSystem[4])(local_1088,pFVar2,&local_10c0);
    CVar7 = local_1088[0];
    this = local_1098;
    local_1088[0].twine = (Twine *)0x0;
    if (&(local_10c0.twine)->LHS != &local_10b0) {
      operator_delete(local_10c0.twine,(ulong)((long)&(local_10b0.twine)->LHS + 1));
    }
    pvVar5 = local_10a0;
    if (&(local_1040.twine)->LHS != &local_1030) {
      free(local_1040.twine);
    }
  }
  local_10a8 = SUB81(depsPath,0);
  if (&(CVar7.twine)->LHS == (Child *)0x0) {
    pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate(system);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10c0,
                   "unable to open dependencies file (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)context);
    plVar4 = (long *)std::__cxx11::string::append(&local_10c0.character);
    pCVar6 = (Child *)(plVar4 + 2);
    if ((Child *)*plVar4 == pCVar6) {
      local_1030.twine = pCVar6->twine;
      pvStack_1028 = (void *)plVar4[3];
      local_1040.twine = (Twine *)&local_1030;
    }
    else {
      local_1030.twine = pCVar6->twine;
      local_1040.decUL = ((unsigned_long *)*plVar4).decUL;
    }
    local_1038 = (BuildSystem *)plVar4[1];
    *plVar4 = (long)pCVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    (*pBVar3->_vptr_BuildSystemDelegate[0xb])(pBVar3,this,local_1040.twine);
    if (local_1040.twine != (Twine *)&local_1030) {
      operator_delete(local_1040.twine,(ulong)((long)&(local_1030.twine)->LHS + 1));
    }
    if (&(local_10c0.twine)->LHS != &local_10b0) {
      operator_delete(local_10c0.twine,(ulong)((long)&(local_10b0.twine)->LHS + 1));
    }
    bVar1 = false;
  }
  else {
    local_1018 = context->_vptr_QueueJobContext;
    pp_Stack_1010 = context[1]._vptr_QueueJobContext;
    local_1040.twine = (Twine *)&PTR__ParseActions_0023b238;
    local_1030 = local_1090;
    local_1008 = 0;
    local_10c0 = (Child)(CVar7.stdString)->_M_string_length;
    local_10b8 = *(long *)&(CVar7.twine)->LHSKind - (long)local_10c0;
    local_10b0.twine = (Twine *)&local_1040;
    local_1038 = system;
    pvStack_1028 = pvVar5;
    local_1020 = this;
    llbuild::core::MakefileDepsParser::parse((MakefileDepsParser *)&local_10c0);
    bVar1 = local_1008 == 0;
    llbuild::core::MakefileDepsParser::ParseActions::~ParseActions((ParseActions *)&local_1040);
    (*(code *)((Twine *)*CVar7.decUL)->RHS)(CVar7.twine);
  }
  return bVar1;
}

Assistant:

bool processMakefileDiscoveredDependencies(BuildSystem& system,
                                             core::TaskInterface ti,
                                             QueueJobContext* context,
                                             std::string depsPath,
                                             bool ignoreSubsequentOutputs) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }
    
    // Parse the output.
    //
    // We just ignore the rule, and add any dependency that we encounter in the
    // file.
    struct DepsActions : public core::MakefileDepsParser::ParseActions {
      BuildSystem& system;
      core::TaskInterface ti;
      CAPIExternalCommand* command;
      StringRef depsPath;
      unsigned numErrors{0};
      
      DepsActions(BuildSystem& system,
                  core::TaskInterface ti,
                  CAPIExternalCommand* command, StringRef depsPath)
      : system(system), ti(ti), command(command), depsPath(depsPath) {}
      
      virtual void error(StringRef message, uint64_t position) override {
        system.getDelegate().commandHadError(command, "error reading dependency file '" + depsPath.str() + "': " + std::string(message));
        ++numErrors;
      }
      
      virtual void actOnRuleDependency(StringRef dependency,
                                       StringRef unescapedWord) override {
        if (llvm::sys::path::is_absolute(unescapedWord)) {
          ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
          system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
          return;
        }

        // Generate absolute path
        //
        // NOTE: This is making the assumption that relative paths coming in a
        // dependency file are in relation to the explictly set working
        // directory, or the current working directory when it has not been set.
        SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
        llvm::sys::path::append(absPath, unescapedWord);
        llvm::sys::fs::make_absolute(absPath);

        ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
      }

      virtual void actOnRuleStart(StringRef name,
                                  const StringRef unescapedWord) override {}

      virtual void actOnRuleEnd() override {}
    };
    
    DepsActions actions(system, ti, this, depsPath);
    core::MakefileDepsParser(input->getBuffer(), actions, ignoreSubsequentOutputs).parse();
    return actions.numErrors == 0;
  }